

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O2

bool M_AppendPNGChunk(FILE *file,DWORD chunkID,BYTE *chunkData,DWORD len)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint local_2c;
  DWORD head [2];
  
  head[0] = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
  head[1] = chunkID;
  sVar2 = fwrite(head,1,8,(FILE *)file);
  if (sVar2 == 8) {
    if (len != 0) {
      sVar2 = fwrite(chunkData,1,(ulong)len,(FILE *)file);
      if (sVar2 != len) goto LAB_0046d6e3;
    }
    uVar1 = CalcCRC32((BYTE *)(head + 1),4);
    if (len != 0) {
      uVar1 = crc32(uVar1,chunkData,len);
    }
    local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    sVar2 = fwrite(&local_2c,1,4,(FILE *)file);
    bVar3 = sVar2 == 4;
  }
  else {
LAB_0046d6e3:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool M_AppendPNGChunk (FILE *file, DWORD chunkID, const BYTE *chunkData, DWORD len)
{
	DWORD head[2] = { BigLong((unsigned int)len), chunkID };
	DWORD crc;

	if (fwrite (head, 1, 8, file) == 8 &&
		(len == 0 || fwrite (chunkData, 1, len, file) == len))
	{
		crc = CalcCRC32 ((BYTE *)&head[1], 4);
		if (len != 0)
		{
			crc = AddCRC32 (crc, chunkData, len);
		}
		crc = BigLong((unsigned int)crc);
		return fwrite (&crc, 1, 4, file) == 4;
	}
	return false;
}